

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall fixedMeasurement_invalid_Test::TestBody(fixedMeasurement_invalid_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_340;
  AssertHelper local_320;
  Message local_318;
  bool local_309;
  undefined1 local_308 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_2d8;
  Message local_2d0;
  bool local_2c1;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar__8;
  fixed_measurement iv5;
  AssertHelper local_280;
  Message local_278;
  bool local_269;
  undefined1 local_268 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_238;
  Message local_230;
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__6;
  fixed_measurement iv4;
  AssertHelper local_1e0;
  Message local_1d8;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_198;
  Message local_190;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__4;
  fixed_measurement iv3;
  AssertHelper local_140;
  Message local_138;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_f8;
  Message local_f0;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__2;
  fixed_measurement iv2;
  AssertHelper local_a0;
  Message local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_58;
  Message local_50 [3];
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  fixed_measurement iv1;
  fixedMeasurement_invalid_Test *this_local;
  
  units::fixed_measurement::fixed_measurement
            ((fixed_measurement *)&gtest_ar_.message_,1.2,(unit *)&units::invalid);
  local_31 = units::is_valid((fixed_measurement *)&gtest_ar_.message_);
  local_31 = !local_31;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_30,
               (AssertionResult *)"is_valid(iv1)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1bd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_89 = units::isnormal((fixed_measurement *)&gtest_ar_.message_);
  local_89 = !local_89;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&iv2.units_,(internal *)local_88,(AssertionResult *)"isnormal(iv1)","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1be,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&iv2.units_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  units::fixed_measurement::fixed_measurement
            ((fixed_measurement *)&gtest_ar__2.message_,NAN,(unit *)&units::m);
  local_e1 = units::is_valid((fixed_measurement *)&gtest_ar__2.message_);
  local_e1 = !local_e1;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e0,&local_e1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_e0,
               (AssertionResult *)"is_valid(iv2)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1c1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_129 = units::isnormal((fixed_measurement *)&gtest_ar__2.message_);
  local_129 = !local_129;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&iv3.units_,(internal *)local_128,(AssertionResult *)"isnormal(iv2)","true"
               ,"false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1c2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&iv3.units_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  units::fixed_measurement::fixed_measurement
            ((fixed_measurement *)&gtest_ar__4.message_,INFINITY,(unit *)&units::m);
  local_181 = units::is_valid((fixed_measurement *)&gtest_ar__4.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_180,&local_181,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_180,
               (AssertionResult *)"is_valid(iv3)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1c5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1c9 = units::isnormal((fixed_measurement *)&gtest_ar__4.message_);
  local_1c9 = !local_1c9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&iv4.units_,(internal *)local_1c8,(AssertionResult *)"isnormal(iv3)","true"
               ,"false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1c6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&iv4.units_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  units::fixed_measurement::fixed_measurement
            ((fixed_measurement *)&gtest_ar__6.message_,9.99999999999948e-312,(unit *)&units::m);
  local_221 = units::is_valid((fixed_measurement *)&gtest_ar__6.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_220,&local_221,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_220,
               (AssertionResult *)"is_valid(iv4)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1c9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  local_269 = units::isnormal((fixed_measurement *)&gtest_ar__6.message_);
  local_269 = !local_269;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_268,&local_269,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&iv5.units_,(internal *)local_268,(AssertionResult *)"isnormal(iv4)","true"
               ,"false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1ca,pcVar2);
    testing::internal::AssertHelper::operator=(&local_280,&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    std::__cxx11::string::~string((string *)&iv5.units_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  units::fixed_measurement::fixed_measurement
            ((fixed_measurement *)&gtest_ar__8.message_,0.0,(unit *)&units::m);
  local_2c1 = units::is_valid((fixed_measurement *)&gtest_ar__8.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2c0,&local_2c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_2c0,
               (AssertionResult *)"is_valid(iv5)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1cd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  local_309 = units::isnormal((fixed_measurement *)&gtest_ar__8.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_308,&local_309,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_340,(internal *)local_308,(AssertionResult *)"isnormal(iv5)","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1ce,pcVar2);
    testing::internal::AssertHelper::operator=(&local_320,&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  return;
}

Assistant:

TEST(fixedMeasurement, invalid)
{
    fixed_measurement iv1(1.2, invalid);
    EXPECT_FALSE(is_valid(iv1));
    EXPECT_FALSE(isnormal(iv1));

    fixed_measurement iv2(constants::invalid_conversion, m);
    EXPECT_FALSE(is_valid(iv2));
    EXPECT_FALSE(isnormal(iv2));

    fixed_measurement iv3(constants::infinity, m);
    EXPECT_TRUE(is_valid(iv3));
    EXPECT_FALSE(isnormal(iv3));

    fixed_measurement iv4(1e-311, m);  // subnormal
    EXPECT_TRUE(is_valid(iv4));
    EXPECT_FALSE(isnormal(iv4));

    fixed_measurement iv5(0.0, m);
    EXPECT_TRUE(is_valid(iv5));
    EXPECT_TRUE(isnormal(iv5));
}